

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_unk_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  jas_stream_t *out_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  return -1;
}

Assistant:

static int jpc_unk_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	/* Eliminate compiler warning about unused variables. */
	(void)cstate;
	(void)ms;
	(void)out;

	/* If this function is called, we are trying to write an unsupported
	  type of marker segment.  Return with an error indication.  */
	return -1;
}